

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::IncompleteCubeSizeCase::IncompleteCubeSizeCase
          (IncompleteCubeSizeCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name,
          char *description,IVec2 *size,IVec2 *invalidLevelSize,int invalidLevelNdx)

{
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,description);
  (this->super_TexCubeCompletenessCase).m_testCtx = testCtx;
  (this->super_TexCubeCompletenessCase).m_renderCtx = renderCtx;
  (this->super_TexCubeCompletenessCase).m_compareColor.m_value = 0xff000000;
  (this->super_TexCubeCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_021206d0;
  *(int *)&(this->super_TexCubeCompletenessCase).field_0x84 = invalidLevelNdx;
  (this->m_invalidLevelSize).m_data[0] = invalidLevelSize->m_data[0];
  (this->m_invalidLevelSize).m_data[1] = invalidLevelSize->m_data[1];
  this->m_invalidCubeFace = CUBEFACE_LAST;
  (this->m_size).m_data[0] = size->m_data[0];
  (this->m_size).m_data[1] = size->m_data[1];
  return;
}

Assistant:

IncompleteCubeSizeCase::IncompleteCubeSizeCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, IVec2 invalidLevelSize, int invalidLevelNdx)
	: TexCubeCompletenessCase		(testCtx, renderCtx, name, description)
	, m_invalidLevelNdx				(invalidLevelNdx)
	, m_invalidLevelSize			(invalidLevelSize)
	, m_invalidCubeFace				(tcu::CUBEFACE_LAST)
	, m_size						(size)
{
}